

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

Result<wallet::SelectionResult> *
wallet::KnapsackSolver
          (Result<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
          CAmount *nTargetValue,CAmount change_target,FastRandomContext *rng,
          int max_selection_weight)

{
  string_view source_file;
  undefined1 *puVar1;
  _Variant_base<bilingual_str,_wallet::SelectionResult> *p_Var2;
  undefined1 *puVar3;
  _Rb_tree_color _Var4;
  long lVar5;
  ulong uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  Logger *pLVar8;
  pointer pOVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer pOVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  OutputGroup *group;
  ulong uVar13;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
  __i;
  long lVar14;
  pointer pOVar15;
  long lVar16;
  long in_FS_OFFSET;
  bool bVar17;
  string_view str;
  string_view logging_function;
  CAmount nBest;
  vector<char,_std::allocator<char>_> vfBest;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> applicable_groups;
  optional<wallet::OutputGroup> lowest_larger;
  string log_message;
  SelectionResult result;
  string log_msg;
  int in_stack_fffffffffffffb90;
  long local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> local_418;
  optional<wallet::OutputGroup> local_3f8;
  undefined1 local_388 [112];
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [120];
  undefined8 local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 *local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_228 [112];
  undefined1 local_1b8 [112];
  SelectionResult local_148;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_148.m_target = *nTargetValue;
  local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_148 + 8);
  local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148.m_algo = 1;
  local_148.m_use_effective = false;
  local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  local_148.m_algo_completed = true;
  local_148.m_weight = 0;
  local_148.bump_fee_group_discount = 0;
  local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
  super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
  super__Optional_payload_base<wallet::OutputGroup>._M_engaged = false;
  local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  shuffle<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,FastRandomContext&>
            ((groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
             ._M_impl.super__Vector_impl_data._M_start,
             (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
             ._M_impl.super__Vector_impl_data._M_finish,rng);
  pOVar9 = (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pOVar10 = (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar9 == pOVar10) {
    lVar16 = 0;
    bVar17 = false;
  }
  else {
    bVar17 = false;
    lVar16 = 0;
    do {
      if (max_selection_weight < pOVar9->m_weight) {
        bVar17 = true;
      }
      else {
        lVar5 = *(long *)((long)&pOVar9->m_value +
                         (ulong)((pOVar9->m_subtract_fee_outputs ^ 1) << 5));
        if (lVar5 == *nTargetValue) {
          SelectionResult::
          InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                    ((SelectionResult *)(local_1b8 + 0x70),&pOVar9->m_outputs);
          p_Var12 = local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent;
          bVar17 = pOVar9->m_subtract_fee_outputs;
          local_148.m_use_effective = (bool)(bVar17 ^ 1);
          local_148.m_weight = local_148.m_weight + pOVar9->m_weight;
          puVar3 = local_1b8 + 8;
          puVar1 = local_1b8 + 0x70;
          if (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
              (_Base_ptr)0x0) {
            puVar1 = local_1b8;
            local_1b8._16_8_ = (_Base_ptr)0x0;
            local_1b8._8_4_ = _S_red;
            local_1b8._24_8_ = puVar3;
            local_1b8._32_8_ = puVar3;
          }
          else {
            local_1b8._16_8_ =
                 local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
            _M_parent = (_Base_ptr)puVar3;
            local_1b8._40_8_ =
                 local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
            local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            local_1b8._24_8_ =
                 local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_1b8._32_8_ =
                 local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            local_1b8._8_4_ =
                 local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
            local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)((long)&local_148 + 8U);
            local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)((long)&local_148 + 8U);
          }
          *(undefined8 *)(puVar1 + 0x28) = 0;
          local_1b8._56_8_ = CONCAT62(local_148._58_6_,CONCAT11(bVar17,local_148.m_algo)) ^ 0x100;
          local_1b8._72_8_ =
               CONCAT71(local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._9_7_,
                        local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._M_engaged);
          local_1b8._80_8_ = CONCAT71(local_148._81_7_,local_148.m_algo_completed);
          local_1b8._96_8_ = CONCAT44(local_148._100_4_,local_148.m_weight);
          local_1b8._48_8_ = local_148.m_target;
          local_1b8._64_8_ =
               local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
          local_1b8._88_8_ = local_148.m_selections_evaluated;
          local_1b8._104_8_ = local_148.bump_fee_group_discount;
          p_Var11 = (_Base_ptr)
                    ((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8
                    );
          if (p_Var12 == (_Base_ptr)0x0) {
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
                 0;
            p_Var2 = &(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::SelectionResult>;
            _Var4 = _S_red;
            p_Var12 = p_Var11;
          }
          else {
            *(_Base_ptr *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
                 p_Var12;
            p_Var12->_M_parent = p_Var11;
            p_Var2 = (_Variant_base<bilingual_str,_wallet::SelectionResult> *)local_1b8;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
                 local_1b8._40_8_;
            local_1b8._16_8_ = (_Base_ptr)0x0;
            p_Var11 = (_Base_ptr)local_1b8._24_8_;
            p_Var12 = (_Base_ptr)local_1b8._32_8_;
            _Var4 = local_1b8._8_4_;
            local_1b8._24_8_ = puVar3;
            local_1b8._32_8_ = puVar3;
          }
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
               p_Var11;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
               p_Var12;
          *(undefined8 *)
           ((long)&(p_Var2->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
          *(_Rb_tree_color *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = _Var4
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
               local_1b8._48_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
               local_1b8._56_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
               local_1b8._64_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
               local_1b8._72_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
               local_1b8._80_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
               local_1b8._88_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
               local_1b8._96_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
               local_1b8._104_8_;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) =
               '\x01';
          this = (_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                  *)local_1b8;
          goto LAB_00b6612b;
        }
        if (lVar5 < *nTargetValue + change_target) {
          std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::push_back
                    (&local_418,pOVar9);
          lVar16 = lVar16 + *(long *)((long)&pOVar9->m_value +
                                     (ulong)((pOVar9->m_subtract_fee_outputs ^ 1) << 5));
        }
        else if ((local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
                  super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                  super__Optional_payload_base<wallet::OutputGroup>._M_engaged != true) ||
                (lVar5 < *(long *)((long)&local_3f8.
                                          super__Optional_base<wallet::OutputGroup,_false,_false>.
                                          _M_payload.
                                          super__Optional_payload<wallet::OutputGroup,_true,_false,_false>
                                          .super__Optional_payload_base<wallet::OutputGroup>.
                                          _M_payload +
                                  (ulong)((local_3f8.
                                           super__Optional_base<wallet::OutputGroup,_false,_false>.
                                           _M_payload.
                                           super__Optional_payload<wallet::OutputGroup,_true,_false,_false>
                                           .super__Optional_payload_base<wallet::OutputGroup>.
                                           _M_payload._M_value.m_subtract_fee_outputs ^ 1) << 5) +
                                  0x20))) {
          std::optional<wallet::OutputGroup>::operator=(&local_3f8,pOVar9);
        }
      }
      pOVar9 = pOVar9 + 1;
    } while (pOVar9 != pOVar10);
  }
  pOVar9 = local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = *nTargetValue;
  local_438.field_2._8_8_ = lVar16;
  if (lVar16 == lVar5) {
    if (local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pOVar10 = local_418.
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        SelectionResult::
        InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                  ((SelectionResult *)(local_1b8 + 0x70),&pOVar10->m_outputs);
        local_148.m_use_effective = (bool)(pOVar10->m_subtract_fee_outputs ^ 1);
        local_148.m_weight = local_148.m_weight + pOVar10->m_weight;
        pOVar10 = pOVar10 + 1;
      } while (pOVar10 != pOVar9);
    }
    p_Var12 = local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (max_selection_weight < local_148.m_weight) {
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::clear((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)(local_1b8 + 0x70));
      if (local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged == true) {
        local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged = false;
      }
      local_148.m_weight = 0;
      lVar5 = *nTargetValue;
      bVar17 = true;
      goto LAB_00b656cf;
    }
    puVar1 = local_228 + 8;
    if (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      puVar3 = local_228;
      local_228._16_8_ = (_Base_ptr)0x0;
      local_228._8_4_ = _S_red;
      local_228._24_8_ = puVar1;
      local_228._32_8_ = puVar1;
    }
    else {
      local_228._16_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
      _M_parent = (_Base_ptr)puVar1;
      local_228._40_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      puVar3 = local_1b8 + 0x70;
      local_228._24_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_228._32_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      local_228._8_4_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)((long)&local_148 + 8U);
      local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)((long)&local_148 + 8U);
    }
    *(undefined8 *)(puVar3 + 0x28) = 0;
    local_228._56_8_ =
         CONCAT62(local_148._58_6_,CONCAT11(local_148.m_use_effective,local_148.m_algo));
    local_228._72_8_ =
         CONCAT71(local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._9_7_,
                  local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_engaged);
    local_228._80_8_ = CONCAT71(local_148._81_7_,local_148.m_algo_completed);
    local_228._96_8_ = CONCAT44(local_148._100_4_,local_148.m_weight);
    local_228._48_8_ = local_148.m_target;
    local_228._64_8_ =
         local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._M_payload;
    local_228._88_8_ = local_148.m_selections_evaluated;
    local_228._104_8_ = local_148.bump_fee_group_discount;
    p_Var11 = (_Base_ptr)
              ((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
    if (p_Var12 == (_Base_ptr)0x0) {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
      p_Var2 = &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::SelectionResult>;
      _Var4 = _S_red;
      p_Var12 = p_Var11;
    }
    else {
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
           p_Var12;
      p_Var12->_M_parent = p_Var11;
      p_Var2 = (_Variant_base<bilingual_str,_wallet::SelectionResult> *)local_228;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
           local_228._40_8_;
      local_228._16_8_ = (_Base_ptr)0x0;
      p_Var11 = (_Base_ptr)local_228._24_8_;
      p_Var12 = (_Base_ptr)local_228._32_8_;
      _Var4 = local_228._8_4_;
      local_228._24_8_ = puVar1;
      local_228._32_8_ = puVar1;
    }
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = p_Var11;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) = p_Var12;
    *(undefined8 *)
     ((long)&(p_Var2->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
    *(_Rb_tree_color *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = _Var4;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
         local_228._48_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
         local_228._56_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
         local_228._64_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
         local_228._72_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
         local_228._80_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
         local_228._88_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
         local_228._96_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
         local_228._104_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\x01';
    this = (_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            *)local_228;
  }
  else {
LAB_00b656cf:
    pOVar10 = local_418.
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pOVar9 = local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (lVar5 <= lVar16) {
      if (local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar14 = (long)local_418.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_418.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = (lVar14 >> 3) * 0x4ec4ec4ec4ec4ec5;
        lVar5 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                  (local_418.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_418.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar14 < 0x681) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                    (pOVar9,pOVar10);
        }
        else {
          pOVar15 = pOVar9 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                    (pOVar9,pOVar15);
          for (; pOVar15 != pOVar10; pOVar15 = pOVar15 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Val_comp_iter<wallet::__0>>
                      (pOVar15);
          }
        }
      }
      args_1 = &local_438;
      local_438._M_dataplus._M_p = (pointer)0x0;
      local_438._M_string_length = 0;
      local_438.field_2._M_allocated_capacity = 0;
      ApproximateBestSubset
                (rng,&local_418,(CAmount *)(local_438.field_2._M_local_buf + 8),nTargetValue,
                 (vector<char,_std::allocator<char>_> *)args_1,&local_440,max_selection_weight,
                 in_stack_fffffffffffffb90);
      if ((local_440 != *nTargetValue) &&
         (paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(*nTargetValue + change_target), (long)paVar7 <= lVar16)) {
        args_1 = &local_438;
        local_58._M_dataplus._M_p = (pointer)paVar7;
        ApproximateBestSubset
                  (rng,&local_418,(CAmount *)(local_438.field_2._M_local_buf + 8),
                   (CAmount *)&local_58,(vector<char,_std::allocator<char>_> *)args_1,&local_440,
                   max_selection_weight,in_stack_fffffffffffffb90);
      }
      if ((local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
           super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
           super__Optional_payload_base<wallet::OutputGroup>._M_engaged == true) &&
         ((local_440 != *nTargetValue && local_440 < change_target + *nTargetValue ||
          (*(long *)((long)&local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                            super__Optional_payload_base<wallet::OutputGroup>._M_payload +
                    (ulong)((local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>.
                             _M_payload.
                             super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                             super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                             m_subtract_fee_outputs ^ 1) << 5) + 0x20) <= local_440)))) {
        SelectionResult::
        InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                  ((SelectionResult *)(local_1b8 + 0x70),
                   (vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                    *)&local_3f8);
        local_148.m_use_effective =
             (bool)(local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
                    super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                    super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                    m_subtract_fee_outputs ^ 1);
        local_148.m_weight =
             local_148.m_weight +
             local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
             super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
             super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.m_weight;
LAB_00b65c8b:
        p_Var12 = local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        puVar1 = local_1b8 + 0x70;
        puVar3 = local_388 + 8;
        if (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          puVar1 = local_388;
          local_388._16_8_ = (_Base_ptr)0x0;
          local_388._8_4_ = _S_red;
          local_388._24_8_ = puVar3;
          local_388._32_8_ = puVar3;
        }
        else {
          local_388._16_8_ =
               local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
          _M_parent = (_Base_ptr)puVar3;
          local_388._40_8_ =
               local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_388._24_8_ =
               local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_388._32_8_ =
               local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          local_388._8_4_ =
               local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)((long)&local_148 + 8U);
          local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)((long)&local_148 + 8U);
        }
        *(undefined8 *)(puVar1 + 0x28) = 0;
        local_388._56_8_ =
             CONCAT62(local_148._58_6_,CONCAT11(local_148.m_use_effective,local_148.m_algo));
        local_388._72_8_ =
             CONCAT71(local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._9_7_,
                      local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_engaged);
        local_388._80_8_ = CONCAT71(local_148._81_7_,local_148.m_algo_completed);
        local_388._96_8_ = CONCAT44(local_148._100_4_,local_148.m_weight);
        local_388._48_8_ = local_148.m_target;
        local_388._64_8_ =
             local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        local_388._88_8_ = local_148.m_selections_evaluated;
        local_388._104_8_ = local_148.bump_fee_group_discount;
        p_Var11 = (_Base_ptr)
                  ((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
        if (p_Var12 == (_Base_ptr)0x0) {
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
          p_Var2 = &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_wallet::SelectionResult>;
          _Var4 = _S_red;
          p_Var12 = p_Var11;
        }
        else {
          p_Var2 = (_Variant_base<bilingual_str,_wallet::SelectionResult> *)local_388;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
               p_Var12;
          p_Var12->_M_parent = p_Var11;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
               local_388._40_8_;
          local_388._16_8_ = (_Base_ptr)0x0;
          p_Var11 = (_Base_ptr)local_388._24_8_;
          p_Var12 = (_Base_ptr)local_388._32_8_;
          _Var4 = local_388._8_4_;
          local_388._24_8_ = puVar3;
          local_388._32_8_ = puVar3;
        }
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
             p_Var11;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
             p_Var12;
        *(undefined8 *)
         ((long)&(p_Var2->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
        *(_Rb_tree_color *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = _Var4;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
             local_388._48_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
             local_388._56_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
             local_388._64_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
             local_388._72_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
             local_388._80_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
             local_388._88_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
             local_388._96_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
             local_388._104_8_;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) =
             '\x01';
        std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                     *)local_388);
      }
      else {
        if (local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_418.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          pOVar9 = local_418.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar6 = 0;
          pOVar10 = local_418.
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar13 = 1;
          do {
            if (local_438._M_dataplus._M_p[uVar6] != '\0') {
              pOVar10 = pOVar10 + uVar6;
              SelectionResult::
              InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                        ((SelectionResult *)(local_1b8 + 0x70),&pOVar10->m_outputs);
              local_148.m_use_effective = (bool)(pOVar10->m_subtract_fee_outputs ^ 1);
              local_148.m_weight = local_148.m_weight + pOVar10->m_weight;
              pOVar9 = local_418.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pOVar10 = local_418.
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            uVar6 = ((long)pOVar9 - (long)pOVar10 >> 3) * 0x4ec4ec4ec4ec4ec5;
            bVar17 = uVar13 <= uVar6;
            lVar16 = uVar6 - uVar13;
            uVar6 = uVar13;
            uVar13 = (ulong)((int)uVar13 + 1);
          } while (bVar17 && lVar16 != 0);
        }
        if (local_148.m_weight <= max_selection_weight) {
LAB_00b65a78:
          pLVar8 = LogInstance();
          bVar17 = BCLog::Logger::WillLogCategoryLevel(pLVar8,SELECTCOINS,Debug);
          if (bVar17) {
            local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2f8,"Coin selection best subset: ","");
            if (local_418.
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_418.
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              pOVar9 = local_418.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pOVar10 = local_418.
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar6 = 0;
              uVar13 = 1;
              do {
                if (local_438._M_dataplus._M_p[uVar6] != '\0') {
                  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (uVar6 * 0x68);
                  FormatMoney_abi_cxx11_(&local_78,pOVar9[uVar6].m_value);
                  tinyformat::format<std::__cxx11::string>
                            (&local_58,(tinyformat *)0x11263bf,(char *)&local_78,args);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_2f8,local_58._M_dataplus._M_p,local_58._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                             local_58.field_2._M_local_buf[0]) + 1);
                  }
                  pOVar9 = local_418.
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pOVar10 = local_418.
                            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                    operator_delete(local_78._M_dataplus._M_p,
                                    local_78.field_2._M_allocated_capacity + 1);
                    pOVar9 = local_418.
                             super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    pOVar10 = local_418.
                              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                }
                uVar6 = ((long)pOVar10 - (long)pOVar9 >> 3) * 0x4ec4ec4ec4ec4ec5;
                bVar17 = uVar13 <= uVar6;
                lVar16 = uVar6 - uVar13;
                uVar6 = uVar13;
                uVar13 = (ulong)((int)uVar13 + 1);
              } while (bVar17 && lVar16 != 0);
            }
            pLVar8 = LogInstance();
            bVar17 = BCLog::Logger::WillLogCategoryLevel(pLVar8,SELECTCOINS,Debug);
            if (bVar17) {
              FormatMoney_abi_cxx11_(&local_318,local_440);
              pLVar8 = LogInstance();
              bVar17 = BCLog::Logger::Enabled(pLVar8);
              if (bVar17) {
                local_58._M_string_length = 0;
                local_58.field_2._M_local_buf[0] = '\0';
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                          (&local_78,(tinyformat *)"%stotal %s\n",(char *)&local_2f8,&local_318,
                           args_1);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&local_58,&local_78);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
                pLVar8 = LogInstance();
                local_78._M_dataplus._M_p = (pointer)0x61;
                local_78._M_string_length = 0x10f8b3a;
                source_file._M_str._0_4_ = 0x10f8b3a;
                source_file._M_len = 0x61;
                source_file._M_str._4_4_ = 0;
                str._M_str = local_58._M_dataplus._M_p;
                str._M_len = local_58._M_string_length;
                logging_function._M_str = "KnapsackSolver";
                logging_function._M_len = 0xe;
                BCLog::Logger::LogPrintStr
                          (pLVar8,str,logging_function,source_file,0x2e7,SELECTCOINS,Debug);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                           local_58.field_2._M_local_buf[0]) + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_dataplus._M_p != &local_318.field_2) {
                operator_delete(local_318._M_dataplus._M_p,
                                local_318.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          goto LAB_00b65c8b;
        }
        if (local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
            super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
            super__Optional_payload_base<wallet::OutputGroup>._M_engaged != false) {
          std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::clear((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)(local_1b8 + 0x70));
          if (local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged == true) {
            local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged = false;
          }
          local_148.m_weight = 0;
          SelectionResult::
          InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                    ((SelectionResult *)(local_1b8 + 0x70),
                     (vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      *)&local_3f8);
          local_148.m_use_effective =
               (bool)(local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
                      super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                      super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                      m_subtract_fee_outputs ^ 1);
          local_148.m_weight =
               local_148.m_weight +
               local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
               super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
               super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.m_weight;
          goto LAB_00b65a78;
        }
        ErrorMaxWeightExceeded();
      }
      if (local_438._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_438._M_dataplus._M_p,
                        local_438.field_2._M_allocated_capacity - (long)local_438._M_dataplus._M_p);
      }
      goto LAB_00b66130;
    }
    if (local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
        super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
        super__Optional_payload_base<wallet::OutputGroup>._M_engaged == false) {
      if (bVar17) {
        ErrorMaxWeightExceeded();
      }
      else {
        local_2d8._112_8_ = &local_258;
        uStack_230 = 0;
        uStack_250 = 0;
        local_248 = &local_238;
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
        local_260 = 0;
        local_258 = 0;
        *(undefined1 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
        uStack_240 = 0;
        local_238 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\0'
        ;
      }
      goto LAB_00b66130;
    }
    SelectionResult::
    InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
              ((SelectionResult *)(local_1b8 + 0x70),
               (vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                *)&local_3f8);
    p_Var12 = local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_148.m_use_effective =
         (bool)(local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
                super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                m_subtract_fee_outputs ^ 1);
    local_148.m_weight =
         local_148.m_weight +
         local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
         super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
         super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.m_weight;
    puVar3 = local_2d8 + 8;
    puVar1 = local_1b8 + 0x70;
    if (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      puVar1 = local_2d8;
      local_2d8._16_8_ = (_Base_ptr)0x0;
      local_2d8._8_4_ = _S_red;
      local_2d8._24_8_ = puVar3;
      local_2d8._32_8_ = puVar3;
    }
    else {
      local_2d8._16_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
      _M_parent = (_Base_ptr)puVar3;
      local_2d8._40_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_2d8._24_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_2d8._32_8_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      local_2d8._8_4_ =
           local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)((long)&local_148 + 8U);
      local_148.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)((long)&local_148 + 8U);
    }
    *(undefined8 *)(puVar1 + 0x28) = 0;
    local_2d8._56_8_ =
         CONCAT62(local_148._58_6_,
                  CONCAT11(local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>.
                           _M_payload.
                           super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                           super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                           m_subtract_fee_outputs,local_148.m_algo)) ^ 0x100;
    local_2d8._72_8_ =
         CONCAT71(local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._9_7_,
                  local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_engaged);
    local_2d8._80_8_ = CONCAT71(local_148._81_7_,local_148.m_algo_completed);
    local_2d8._96_8_ = CONCAT44(local_148._100_4_,local_148.m_weight);
    local_2d8._48_8_ = local_148.m_target;
    local_2d8._64_8_ =
         local_148.m_waste.super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._M_payload;
    local_2d8._88_8_ = local_148.m_selections_evaluated;
    local_2d8._104_8_ = local_148.bump_fee_group_discount;
    p_Var11 = (_Base_ptr)
              ((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
    if (p_Var12 == (_Base_ptr)0x0) {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
      p_Var2 = &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::SelectionResult>;
      _Var4 = _S_red;
      p_Var12 = p_Var11;
    }
    else {
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
           p_Var12;
      p_Var12->_M_parent = p_Var11;
      p_Var2 = (_Variant_base<bilingual_str,_wallet::SelectionResult> *)local_2d8;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
           local_2d8._40_8_;
      local_2d8._16_8_ = (_Base_ptr)0x0;
      p_Var11 = (_Base_ptr)local_2d8._24_8_;
      p_Var12 = (_Base_ptr)local_2d8._32_8_;
      _Var4 = local_2d8._8_4_;
      local_2d8._24_8_ = puVar3;
      local_2d8._32_8_ = puVar3;
    }
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = p_Var11;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) = p_Var12;
    *(undefined8 *)
     ((long)&(p_Var2->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
    *(_Rb_tree_color *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = _Var4;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
         local_2d8._48_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
         local_2d8._56_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
         local_2d8._64_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
         local_2d8._72_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
         local_2d8._80_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
         local_2d8._88_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
         local_2d8._96_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
         local_2d8._104_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\x01';
    this = (_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            *)local_2d8;
  }
LAB_00b6612b:
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree(this);
LAB_00b66130:
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector(&local_418);
  if (local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
      super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
      super__Optional_payload_base<wallet::OutputGroup>._M_engaged == true) {
    local_3f8.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
    super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
    super__Optional_payload_base<wallet::OutputGroup>._M_engaged = false;
    std::
    vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>::
    ~vector((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
             *)&local_3f8);
  }
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)(local_1b8 + 0x70));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<SelectionResult> KnapsackSolver(std::vector<OutputGroup>& groups, const CAmount& nTargetValue,
                                             CAmount change_target, FastRandomContext& rng, int max_selection_weight)
{
    SelectionResult result(nTargetValue, SelectionAlgorithm::KNAPSACK);

    bool max_weight_exceeded{false};
    // List of values less than target
    std::optional<OutputGroup> lowest_larger;
    // Groups with selection amount smaller than the target and any change we might produce.
    // Don't include groups larger than this, because they will only cause us to overshoot.
    std::vector<OutputGroup> applicable_groups;
    CAmount nTotalLower = 0;

    std::shuffle(groups.begin(), groups.end(), rng);

    for (const OutputGroup& group : groups) {
        if (group.m_weight > max_selection_weight) {
            max_weight_exceeded = true;
            continue;
        }
        if (group.GetSelectionAmount() == nTargetValue) {
            result.AddInput(group);
            return result;
        } else if (group.GetSelectionAmount() < nTargetValue + change_target) {
            applicable_groups.push_back(group);
            nTotalLower += group.GetSelectionAmount();
        } else if (!lowest_larger || group.GetSelectionAmount() < lowest_larger->GetSelectionAmount()) {
            lowest_larger = group;
        }
    }

    if (nTotalLower == nTargetValue) {
        for (const auto& group : applicable_groups) {
            result.AddInput(group);
        }
        if (result.GetWeight() <= max_selection_weight) return result;
        else max_weight_exceeded = true;

        // Try something else
        result.Clear();
    }

    if (nTotalLower < nTargetValue) {
        if (!lowest_larger) {
            if (max_weight_exceeded) return ErrorMaxWeightExceeded();
            return util::Error();
        }
        result.AddInput(*lowest_larger);
        return result;
    }

    // Solve subset sum by stochastic approximation
    std::sort(applicable_groups.begin(), applicable_groups.end(), descending);
    std::vector<char> vfBest;
    CAmount nBest;

    ApproximateBestSubset(rng, applicable_groups, nTotalLower, nTargetValue, vfBest, nBest, max_selection_weight);
    if (nBest != nTargetValue && nTotalLower >= nTargetValue + change_target) {
        ApproximateBestSubset(rng, applicable_groups, nTotalLower, nTargetValue + change_target, vfBest, nBest, max_selection_weight);
    }

    // If we have a bigger coin and (either the stochastic approximation didn't find a good solution,
    //                                   or the next bigger coin is closer), return the bigger coin
    if (lowest_larger &&
        ((nBest != nTargetValue && nBest < nTargetValue + change_target) || lowest_larger->GetSelectionAmount() <= nBest)) {
        result.AddInput(*lowest_larger);
    } else {
        for (unsigned int i = 0; i < applicable_groups.size(); i++) {
            if (vfBest[i]) {
                result.AddInput(applicable_groups[i]);
            }
        }

        // If the result exceeds the maximum allowed size, return closest UTXO above the target
        if (result.GetWeight() > max_selection_weight) {
            // No coin above target, nothing to do.
            if (!lowest_larger) return ErrorMaxWeightExceeded();

            // Return closest UTXO above target
            result.Clear();
            result.AddInput(*lowest_larger);
        }

        if (LogAcceptCategory(BCLog::SELECTCOINS, BCLog::Level::Debug)) {
            std::string log_message{"Coin selection best subset: "};
            for (unsigned int i = 0; i < applicable_groups.size(); i++) {
                if (vfBest[i]) {
                    log_message += strprintf("%s ", FormatMoney(applicable_groups[i].m_value));
                }
            }
            LogDebug(BCLog::SELECTCOINS, "%stotal %s\n", log_message, FormatMoney(nBest));
        }
    }
    Assume(result.GetWeight() <= max_selection_weight);
    return result;
}